

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InThread.cpp
# Opt level: O3

void __thiscall Thread::run(Thread *this)

{
  undefined8 uVar1;
  undefined6 uVar2;
  Element *pEVar3;
  long lVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  AutoTableElement tableElement;
  Report report;
  TextElement textElement;
  TextElement titleElement;
  ImageElement imageElement;
  HelloWorldTableModel tableModel;
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_138;
  QString local_110;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QByteArrayView local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  undefined4 local_50;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  undefined6 uStack_48;
  undefined **local_40 [2];
  
  KDReports::Report::Report((Report *)&local_110,(QObject *)0x0);
  local_c0.m_size = 0x1071e2;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_a8,(char **)&local_c0)
  ;
  QVar5.m_data._4_4_ = local_a8.d._4_4_;
  QVar5.m_data._0_4_ = local_a8.d._0_4_;
  QVar5.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar5);
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  local_138.ptr._6_2_ = 0;
  local_68.size = local_138.size;
  local_138.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QImage::QImage((QImage *)&local_158,(QString *)&local_68,(char *)0x0);
  KDReports::Report::setWatermarkImage((QImage *)&local_110);
  QImage::~QImage((QImage *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  local_138.size = 0;
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  local_138.ptr._6_2_ = 0;
  local_a8.d._0_4_ = 1;
  local_a8.d._4_4_ = 0xccccffff;
  local_a8.ptr._0_4_ = 0xcccccccc;
  local_a8.ptr._4_2_ = 0;
  local_158.d._0_4_ = 0;
  local_158.d._4_2_ = 0;
  local_158.d._6_2_ = 0;
  local_158.ptr._0_6_ = 0x107492;
  local_158.ptr._6_2_ = 0;
  local_158.size = 9;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QFont::QFont((QFont *)&local_c0,(QString *)&local_158,0x30,-1,false);
  KDReports::Report::setWatermarkText(&local_110,(int)&local_138,(QColor *)0x0,(QFont *)&local_a8);
  QFont::~QFont((QFont *)&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  local_f8.d = (Data *)0x1071f3;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_c0,(char **)&local_f8);
  QVar6.m_data = (storage_type *)local_c0.m_size;
  QVar6.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar6);
  local_a8.ptr._6_2_ = local_138.ptr._6_2_;
  uVar2 = local_138.ptr._0_6_;
  local_a8.d._0_4_ = local_138.d._0_4_;
  uVar1 = CONCAT26(local_138.d._6_2_,CONCAT24(local_138.d._4_2_,local_138.d._0_4_));
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  local_138.ptr._6_2_ = 0;
  local_a8.d._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_a8.ptr._0_4_ = (undefined4)uVar2;
  local_a8.ptr._4_2_ = (undefined2)((uint6)uVar2 >> 0x20);
  local_a8.size = local_138.size;
  local_138.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QImage::QImage((QImage *)&local_158,(QString *)&local_a8,(char *)0x0);
  KDReports::ImageElement::ImageElement((ImageElement *)&local_68,(QImage *)&local_158);
  QImage::~QImage((QImage *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  pEVar3 = (Element *)KDReports::Report::header(&local_110,6);
  KDReports::Header::addElement(pEVar3,(AlignmentFlag)&local_68);
  QMetaObject::tr((char *)&local_138,(char *)&QObject::staticMetaObject,0x1071fe);
  KDReports::TextElement::TextElement((TextElement *)&local_a8,(QString *)&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  KDReports::TextElement::setPointSize(18.0);
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0xffff;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_110,(AlignmentFlag)&local_a8,(QColor *)0x4);
  KDReports::Report::addVerticalSpacing(10.0);
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  local_138.ptr._6_2_ = 0;
  local_138.size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_c0,(QString *)&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QMetaObject::tr((char *)&local_138,(char *)&QObject::staticMetaObject,0x10721d);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  local_d8.d = (Data *)0x10724f;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_f8,(char **)&local_d8)
  ;
  QVar7.m_data = (storage_type *)local_f8.d;
  QVar7.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar7);
  local_158.ptr._6_2_ = local_138.ptr._6_2_;
  local_158.ptr._0_6_ = local_138.ptr._0_6_;
  local_158.d._6_2_ = local_138.d._6_2_;
  local_158.d._4_2_ = local_138.d._4_2_;
  local_158.d._0_4_ = local_138.d._0_4_;
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  local_138.ptr._6_2_ = 0;
  local_158.size = local_138.size;
  local_138.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  QMetaObject::tr((char *)&local_138,(char *)&QObject::staticMetaObject,0x107251);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  local_d8.d = (Data *)0x10724f;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_f8,(char **)&local_d8)
  ;
  QVar8.m_data = (storage_type *)local_f8.d;
  QVar8.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar8);
  local_158.ptr._6_2_ = local_138.ptr._6_2_;
  local_158.ptr._0_6_ = local_138.ptr._0_6_;
  local_158.d._6_2_ = local_138.d._6_2_;
  local_158.d._4_2_ = local_138.d._4_2_;
  local_158.d._0_4_ = local_138.d._0_4_;
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  local_138.ptr._6_2_ = 0;
  local_158.size = local_138.size;
  local_138.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  local_138.d._0_4_ = 0;
  local_138.d._4_2_ = 0xffff;
  local_138.d._6_2_ = 0;
  local_138.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_110,(AlignmentFlag)&local_c0,(QColor *)0x1);
  QAbstractTableModel::QAbstractTableModel((QAbstractTableModel *)local_40,(QObject *)0x0);
  local_40[0] = &PTR_metaObject_0011ca30;
  KDReports::Report::addVerticalSpacing(10.0);
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&local_138,(QAbstractItemModel *)local_40);
  KDReports::AbstractTableElement::setBorder(1.0);
  local_158.d._0_4_ = 0;
  local_158.d._4_2_ = 0xffff;
  local_158.d._6_2_ = 0;
  local_158.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_110,(AlignmentFlag)&local_138,(QColor *)0x1);
  lVar4 = 1;
  do {
    local_d8.d = (Data *)0x0;
    local_d8.ptr = L"<b>Customer</b> <em>%1</em>";
    local_d8.size = 0x1b;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    QString::arg((longlong)&local_f8,(int)&local_d8,(int)lVar4,(QChar)0x0);
    KDReports::HtmlElement::HtmlElement((HtmlElement *)&local_158,(QString *)&local_f8);
    local_50 = 0;
    uStack_4c = 0xffff;
    uStack_4a = 0;
    uStack_48 = 0;
    KDReports::Report::addElement((Element *)&local_110,(AlignmentFlag)&local_158,(QColor *)0x1);
    KDReports::HtmlElement::~HtmlElement((HtmlElement *)&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    local_50 = 0x107298;
    uStack_4c = 0;
    uStack_4a = 0;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_88,(char **)&local_50);
    QVar9.m_data = (storage_type *)local_88.d;
    QVar9.m_size = (qsizetype)&local_158;
    QString::fromUtf8(QVar9);
    local_d8.d = (Data *)CONCAT26(local_158.d._6_2_,CONCAT24(local_158.d._4_2_,local_158.d._0_4_));
    local_d8.ptr = (char16_t *)CONCAT26(local_158.ptr._6_2_,local_158.ptr._0_6_);
    local_158.d._0_4_ = 0;
    local_158.d._4_2_ = 0;
    local_158.d._6_2_ = 0;
    local_158.ptr._0_6_ = 0;
    local_158.ptr._6_2_ = 0;
    local_d8.size = local_158.size;
    local_158.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    KDReports::TextElement::TextElement((TextElement *)&local_f8,(QString *)&local_d8);
    KDReports::Report::addInlineElement((Element *)&local_110);
    KDReports::TextElement::~TextElement((TextElement *)&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 100);
  KDReports::Report::addPageBreak();
  local_50 = 0x1072a1;
  uStack_4c = 0;
  uStack_4a = 0;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_88,(char **)&local_50)
  ;
  QVar10.m_data = (storage_type *)local_88.d;
  QVar10.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar10);
  local_d8.d = (Data *)CONCAT26(local_158.d._6_2_,CONCAT24(local_158.d._4_2_,local_158.d._0_4_));
  local_d8.ptr = (char16_t *)CONCAT26(local_158.ptr._6_2_,local_158.ptr._0_6_);
  local_158.d._0_4_ = 0;
  local_158.d._4_2_ = 0;
  local_158.d._6_2_ = 0;
  local_158.ptr._0_6_ = 0;
  local_158.ptr._6_2_ = 0;
  local_d8.size = local_158.size;
  local_158.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  KDReports::TextElement::TextElement((TextElement *)&local_f8,(QString *)&local_d8);
  local_158.d._0_4_ = 0;
  local_158.d._4_2_ = 0xffff;
  local_158.d._6_2_ = 0;
  local_158.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_110,(AlignmentFlag)&local_f8,(QColor *)0x1);
  KDReports::TextElement::~TextElement((TextElement *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_88.d = (Data *)0x1070ba;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_d8,(char **)&local_88)
  ;
  QVar11.m_data = (storage_type *)local_d8.d;
  QVar11.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar11);
  local_f8.d = (Data *)CONCAT26(local_158.d._6_2_,CONCAT24(local_158.d._4_2_,local_158.d._0_4_));
  local_f8.ptr = (char16_t *)CONCAT26(local_158.ptr._6_2_,local_158.ptr._0_6_);
  local_158.d._0_4_ = 0;
  local_158.d._4_2_ = 0;
  local_158.d._6_2_ = 0;
  local_158.ptr._0_6_ = 0;
  local_158.ptr._6_2_ = 0;
  local_f8.size = local_158.size;
  local_158.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  KDReports::Report::exportToImage((QSize)&local_110,(QString *)0x4b0000000c8,(char *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  local_88.d = (Data *)0x107030;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_d8,(char **)&local_88)
  ;
  QVar12.m_data = (storage_type *)local_d8.d;
  QVar12.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar12);
  local_f8.d = (Data *)CONCAT26(local_158.d._6_2_,CONCAT24(local_158.d._4_2_,local_158.d._0_4_));
  local_f8.ptr = (char16_t *)CONCAT26(local_158.ptr._6_2_,local_158.ptr._0_6_);
  local_158.d._0_4_ = 0;
  local_158.d._4_2_ = 0;
  local_158.d._6_2_ = 0;
  local_158.ptr._0_6_ = 0;
  local_158.ptr._6_2_ = 0;
  local_f8.size = local_158.size;
  local_158.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  KDReports::Report::exportToFile(&local_110,(QWidget *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_138);
  QAbstractTableModel::~QAbstractTableModel((QAbstractTableModel *)local_40);
  KDReports::TextElement::~TextElement((TextElement *)&local_c0);
  KDReports::TextElement::~TextElement((TextElement *)&local_a8);
  KDReports::ImageElement::~ImageElement((ImageElement *)&local_68);
  KDReports::Report::~Report((Report *)&local_110);
  return;
}

Assistant:

void run() override
    {

        // Create a report
        KDReports::Report report;

        report.setWatermarkImage(QImage(":/background.jpg"));
        report.setWatermarkText(QString());

        KDReports::ImageElement imageElement(QImage(":/logo.png"));
        report.header().addElement(imageElement);

        // Add a text element for the title
        KDReports::TextElement titleElement(QObject::tr("KD Reports Hello world example"));
        titleElement.setPointSize(18);
        report.addElement(titleElement, Qt::AlignHCenter);

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add another text element, demonstrating "<<" operator
        KDReports::TextElement textElement;
        textElement << QObject::tr("This is a sample report produced with KD Reports.");
        textElement << "\n";
        textElement << QObject::tr("Klarälvdalens Datakonsult AB, Platform-independent software solutions");
        textElement << "\n";
        report.addElement(textElement);

        // Create a table model, which will be used by the table element
        HelloWorldTableModel tableModel;

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add an "auto table" (a table that shows the contents of a model)
        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setBorder(1);
        report.addElement(tableElement);

        // Add many paragraphs, to demonstrate page breaking
        for (int i = 1; i < 100; ++i) {
            report.addElement(KDReports::HtmlElement(QStringLiteral("<b>Customer</b> <em>%1</em>").arg(i)), Qt::AlignLeft);
            report.addInlineElement(KDReports::TextElement("  - 2006"));
        }

        // Add a page break
        report.addPageBreak();

        report.addElement(KDReports::TextElement("This is the last page"));

        // To export to an image file:
        // qDebug() << "Exporting to output.png";
        report.exportToImage(QSize(200, 1200), "output.png", "PNG"); // deleted by main() below

        // To export to a PDF file:
        // qDebug() << "Exporting to output.pdf";
        report.exportToFile("output.pdf"); // deleted by main() below
    }